

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant2.c
# Opt level: O2

void start_pass_2_quant(j_decompress_ptr cinfo,boolean is_pre_scan)

{
  jpeg_color_quantizer *pjVar1;
  _func_void_j_decompress_ptr *p_Var2;
  code *pcVar3;
  _func_void_j_decompress_ptr_boolean *target;
  long lVar4;
  undefined4 uVar5;
  size_t bytestozero;
  undefined8 uVar6;
  long lStack_30;
  
  pjVar1 = cinfo->cquantize;
  p_Var2 = pjVar1[1].finish_pass;
  if (cinfo->dither_mode == JDITHER_NONE) {
    if (is_pre_scan != 0) goto LAB_001262c8;
    pcVar3 = pass2_no_dither;
LAB_00126320:
    pjVar1->color_quantize = pcVar3;
    pjVar1->finish_pass = finish_pass2;
    if (cinfo->actual_number_of_colors < 1) {
      uVar6 = 0x100000038;
LAB_00126352:
      *(undefined8 *)&cinfo->err->msg_code = uVar6;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    else if (0x100 < (uint)cinfo->actual_number_of_colors) {
      uVar6 = 0x10000000039;
      goto LAB_00126352;
    }
    if (cinfo->dither_mode != JDITHER_FS) goto LAB_001262e9;
    bytestozero = (ulong)(cinfo->output_width + 2) * 6;
    target = pjVar1[2].start_pass;
    if (target == (_func_void_j_decompress_ptr_boolean *)0x0) {
      target = (_func_void_j_decompress_ptr_boolean *)
               (*cinfo->mem->alloc_large)((j_common_ptr)cinfo,1,bytestozero);
      pjVar1[2].start_pass = target;
    }
    jzero_far(target,bytestozero);
    uVar5 = 0;
    lStack_30 = 0x48;
    if (pjVar1[2].finish_pass == (_func_void_j_decompress_ptr *)0x0) {
      init_error_limit(cinfo);
      lStack_30 = 0x48;
    }
  }
  else {
    cinfo->dither_mode = JDITHER_FS;
    if (is_pre_scan == 0) {
      pcVar3 = pass2_fs_dither;
      goto LAB_00126320;
    }
LAB_001262c8:
    pjVar1->color_quantize = prescan_quantize;
    pjVar1->finish_pass = finish_pass1;
    uVar5 = 1;
    lStack_30 = 0x38;
  }
  *(undefined4 *)((long)&pjVar1->start_pass + lStack_30) = uVar5;
LAB_001262e9:
  if (*(int *)&pjVar1[1].new_color_map != 0) {
    for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 1) {
      jzero_far(*(void **)(p_Var2 + lVar4 * 8),0x1000);
    }
    *(undefined4 *)&pjVar1[1].new_color_map = 0;
  }
  return;
}

Assistant:

METHODDEF(void)
start_pass_2_quant(j_decompress_ptr cinfo, boolean is_pre_scan)
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr)cinfo->cquantize;
  hist3d histogram = cquantize->histogram;
  int i;

  /* Only F-S dithering or no dithering is supported. */
  /* If user asks for ordered dither, give them F-S. */
  if (cinfo->dither_mode != JDITHER_NONE)
    cinfo->dither_mode = JDITHER_FS;

  if (is_pre_scan) {
    /* Set up method pointers */
    cquantize->pub.color_quantize = prescan_quantize;
    cquantize->pub.finish_pass = finish_pass1;
    cquantize->needs_zeroed = TRUE; /* Always zero histogram */
  } else {
    /* Set up method pointers */
    if (cinfo->dither_mode == JDITHER_FS)
      cquantize->pub.color_quantize = pass2_fs_dither;
    else
      cquantize->pub.color_quantize = pass2_no_dither;
    cquantize->pub.finish_pass = finish_pass2;

    /* Make sure color count is acceptable */
    i = cinfo->actual_number_of_colors;
    if (i < 1)
      ERREXIT1(cinfo, JERR_QUANT_FEW_COLORS, 1);
    if (i > MAXNUMCOLORS)
      ERREXIT1(cinfo, JERR_QUANT_MANY_COLORS, MAXNUMCOLORS);

    if (cinfo->dither_mode == JDITHER_FS) {
      size_t arraysize =
        (size_t)((cinfo->output_width + 2) * (3 * sizeof(FSERROR)));
      /* Allocate Floyd-Steinberg workspace if we didn't already. */
      if (cquantize->fserrors == NULL)
        cquantize->fserrors = (FSERRPTR)(*cinfo->mem->alloc_large)
          ((j_common_ptr)cinfo, JPOOL_IMAGE, arraysize);
      /* Initialize the propagated errors to zero. */
      jzero_far((void *)cquantize->fserrors, arraysize);
      /* Make the error-limit table if we didn't already. */
      if (cquantize->error_limiter == NULL)
        init_error_limit(cinfo);
      cquantize->on_odd_row = FALSE;
    }

  }
  /* Zero the histogram or inverse color map, if necessary */
  if (cquantize->needs_zeroed) {
    for (i = 0; i < HIST_C0_ELEMS; i++) {
      jzero_far((void *)histogram[i],
                HIST_C1_ELEMS * HIST_C2_ELEMS * sizeof(histcell));
    }
    cquantize->needs_zeroed = FALSE;
  }
}